

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall icu_63::MessagePattern::isOrdinal(MessagePattern *this,int32_t index)

{
  char16_t cVar1;
  bool local_22;
  bool local_21;
  UChar c;
  int32_t index_local;
  MessagePattern *this_local;
  
  cVar1 = UnicodeString::charAt(&this->msg,index);
  if ((cVar1 == L'o') || (local_21 = false, cVar1 == L'O')) {
    cVar1 = UnicodeString::charAt(&this->msg,index + 1);
    if ((cVar1 == L'r') || (local_21 = false, cVar1 == L'R')) {
      cVar1 = UnicodeString::charAt(&this->msg,index + 2);
      if ((cVar1 == L'd') || (local_21 = false, cVar1 == L'D')) {
        cVar1 = UnicodeString::charAt(&this->msg,index + 3);
        if ((cVar1 == L'i') || (local_21 = false, cVar1 == L'I')) {
          cVar1 = UnicodeString::charAt(&this->msg,index + 4);
          if ((cVar1 == L'n') || (local_21 = false, cVar1 == L'N')) {
            cVar1 = UnicodeString::charAt(&this->msg,index + 5);
            if ((cVar1 == L'a') || (local_21 = false, cVar1 == L'A')) {
              cVar1 = UnicodeString::charAt(&this->msg,index + 6);
              local_22 = cVar1 == L'l' || cVar1 == L'L';
              local_21 = local_22;
            }
          }
        }
      }
    }
  }
  return local_21;
}

Assistant:

UBool
MessagePattern::isOrdinal(int32_t index) {
    UChar c;
    return
        ((c=msg.charAt(index++))==u_o || c==u_O) &&
        ((c=msg.charAt(index++))==u_r || c==u_R) &&
        ((c=msg.charAt(index++))==u_d || c==u_D) &&
        ((c=msg.charAt(index++))==u_i || c==u_I) &&
        ((c=msg.charAt(index++))==u_n || c==u_N) &&
        ((c=msg.charAt(index++))==u_a || c==u_A) &&
        ((c=msg.charAt(index))==u_l || c==u_L);
}